

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

void __thiscall GraphLibrary::Graph::add_edge(Graph *this,Node v,Node w)

{
  uint in_EDX;
  uint in_ESI;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *in_RDI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *unaff_retaddr;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *__x;
  
  __x = in_RDI;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::operator[](in_RDI,(ulong)in_ESI);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (unaff_retaddr,(value_type *)__x);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::operator[](in_RDI,(ulong)in_EDX);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (unaff_retaddr,(value_type *)__x);
  in_RDI[1].
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((long)&((in_RDI[1].
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish)->
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                        super__Vector_impl_data._M_start + 1);
  return;
}

Assistant:

void Graph::add_edge(const Node v, const Node w) {
        m_adjacency_lists[v].push_back(w);
        m_adjacency_lists[w].push_back(v);

        m_num_edges++;
    }